

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_avg_cdf_symbols(FRAME_CONTEXT *ctx_left,FRAME_CONTEXT *ctx_tr,int wt_left,int wt_tr)

{
  int in_ECX;
  int in_EDX;
  aom_cdf_prob *in_RSI;
  aom_cdf_prob *in_RDI;
  int num_cdfs_73;
  int array_size_73;
  aom_cdf_prob *cdf_ptr_tr_73;
  aom_cdf_prob *cdf_ptr_left_73;
  int num_cdfs_72;
  int array_size_72;
  aom_cdf_prob *cdf_ptr_tr_72;
  aom_cdf_prob *cdf_ptr_left_72;
  int num_cdfs_71;
  int array_size_71;
  aom_cdf_prob *cdf_ptr_tr_71;
  aom_cdf_prob *cdf_ptr_left_71;
  int num_cdfs_70;
  int array_size_70;
  aom_cdf_prob *cdf_ptr_tr_70;
  aom_cdf_prob *cdf_ptr_left_70;
  int num_cdfs_69;
  int array_size_69;
  aom_cdf_prob *cdf_ptr_tr_69;
  aom_cdf_prob *cdf_ptr_left_69;
  int num_cdfs_68;
  int array_size_68;
  aom_cdf_prob *cdf_ptr_tr_68;
  aom_cdf_prob *cdf_ptr_left_68;
  int num_cdfs_67;
  int array_size_67;
  aom_cdf_prob *cdf_ptr_tr_67;
  aom_cdf_prob *cdf_ptr_left_67;
  int num_cdfs_66;
  int array_size_66;
  aom_cdf_prob *cdf_ptr_tr_66;
  aom_cdf_prob *cdf_ptr_left_66;
  int i_1;
  int num_cdfs_65;
  int array_size_65;
  aom_cdf_prob *cdf_ptr_tr_65;
  aom_cdf_prob *cdf_ptr_left_65;
  int num_cdfs_64;
  int array_size_64;
  aom_cdf_prob *cdf_ptr_tr_64;
  aom_cdf_prob *cdf_ptr_left_64;
  int num_cdfs_63;
  int array_size_63;
  aom_cdf_prob *cdf_ptr_tr_63;
  aom_cdf_prob *cdf_ptr_left_63;
  int num_cdfs_62;
  int array_size_62;
  aom_cdf_prob *cdf_ptr_tr_62;
  aom_cdf_prob *cdf_ptr_left_62;
  int num_cdfs_61;
  int array_size_61;
  aom_cdf_prob *cdf_ptr_tr_61;
  aom_cdf_prob *cdf_ptr_left_61;
  int num_cdfs_60;
  int array_size_60;
  aom_cdf_prob *cdf_ptr_tr_60;
  aom_cdf_prob *cdf_ptr_left_60;
  int num_cdfs_59;
  int array_size_59;
  aom_cdf_prob *cdf_ptr_tr_59;
  aom_cdf_prob *cdf_ptr_left_59;
  int num_cdfs_58;
  int array_size_58;
  aom_cdf_prob *cdf_ptr_tr_58;
  aom_cdf_prob *cdf_ptr_left_58;
  int num_cdfs_57;
  int array_size_57;
  aom_cdf_prob *cdf_ptr_tr_57;
  aom_cdf_prob *cdf_ptr_left_57;
  int num_cdfs_56;
  int array_size_56;
  aom_cdf_prob *cdf_ptr_tr_56;
  aom_cdf_prob *cdf_ptr_left_56;
  int num_cdfs_55;
  int array_size_55;
  aom_cdf_prob *cdf_ptr_tr_55;
  aom_cdf_prob *cdf_ptr_left_55;
  int num_cdfs_54;
  int array_size_54;
  aom_cdf_prob *cdf_ptr_tr_54;
  aom_cdf_prob *cdf_ptr_left_54;
  int i;
  int num_cdfs_53;
  int array_size_53;
  aom_cdf_prob *cdf_ptr_tr_53;
  aom_cdf_prob *cdf_ptr_left_53;
  int num_cdfs_52;
  int array_size_52;
  aom_cdf_prob *cdf_ptr_tr_52;
  aom_cdf_prob *cdf_ptr_left_52;
  int num_cdfs_51;
  int array_size_51;
  aom_cdf_prob *cdf_ptr_tr_51;
  aom_cdf_prob *cdf_ptr_left_51;
  int num_cdfs_50;
  int array_size_50;
  aom_cdf_prob *cdf_ptr_tr_50;
  aom_cdf_prob *cdf_ptr_left_50;
  int num_cdfs_49;
  int array_size_49;
  aom_cdf_prob *cdf_ptr_tr_49;
  aom_cdf_prob *cdf_ptr_left_49;
  int num_cdfs_48;
  int array_size_48;
  aom_cdf_prob *cdf_ptr_tr_48;
  aom_cdf_prob *cdf_ptr_left_48;
  int num_cdfs_47;
  int array_size_47;
  aom_cdf_prob *cdf_ptr_tr_47;
  aom_cdf_prob *cdf_ptr_left_47;
  int num_cdfs_46;
  int array_size_46;
  aom_cdf_prob *cdf_ptr_tr_46;
  aom_cdf_prob *cdf_ptr_left_46;
  int num_cdfs_45;
  int array_size_45;
  aom_cdf_prob *cdf_ptr_tr_45;
  aom_cdf_prob *cdf_ptr_left_45;
  int num_cdfs_44;
  int array_size_44;
  aom_cdf_prob *cdf_ptr_tr_44;
  aom_cdf_prob *cdf_ptr_left_44;
  int num_cdfs_43;
  int array_size_43;
  aom_cdf_prob *cdf_ptr_tr_43;
  aom_cdf_prob *cdf_ptr_left_43;
  int num_cdfs_42;
  int array_size_42;
  aom_cdf_prob *cdf_ptr_tr_42;
  aom_cdf_prob *cdf_ptr_left_42;
  int num_cdfs_41;
  int array_size_41;
  aom_cdf_prob *cdf_ptr_tr_41;
  aom_cdf_prob *cdf_ptr_left_41;
  int num_cdfs_40;
  int array_size_40;
  aom_cdf_prob *cdf_ptr_tr_40;
  aom_cdf_prob *cdf_ptr_left_40;
  int num_cdfs_39;
  int array_size_39;
  aom_cdf_prob *cdf_ptr_tr_39;
  aom_cdf_prob *cdf_ptr_left_39;
  int num_cdfs_38;
  int array_size_38;
  aom_cdf_prob *cdf_ptr_tr_38;
  aom_cdf_prob *cdf_ptr_left_38;
  int num_cdfs_37;
  int array_size_37;
  aom_cdf_prob *cdf_ptr_tr_37;
  aom_cdf_prob *cdf_ptr_left_37;
  int num_cdfs_36;
  int array_size_36;
  aom_cdf_prob *cdf_ptr_tr_36;
  aom_cdf_prob *cdf_ptr_left_36;
  int num_cdfs_35;
  int array_size_35;
  aom_cdf_prob *cdf_ptr_tr_35;
  aom_cdf_prob *cdf_ptr_left_35;
  int num_cdfs_34;
  int array_size_34;
  aom_cdf_prob *cdf_ptr_tr_34;
  aom_cdf_prob *cdf_ptr_left_34;
  int num_cdfs_33;
  int array_size_33;
  aom_cdf_prob *cdf_ptr_tr_33;
  aom_cdf_prob *cdf_ptr_left_33;
  int num_cdfs_32;
  int array_size_32;
  aom_cdf_prob *cdf_ptr_tr_32;
  aom_cdf_prob *cdf_ptr_left_32;
  int num_cdfs_31;
  int array_size_31;
  aom_cdf_prob *cdf_ptr_tr_31;
  aom_cdf_prob *cdf_ptr_left_31;
  int num_cdfs_30;
  int array_size_30;
  aom_cdf_prob *cdf_ptr_tr_30;
  aom_cdf_prob *cdf_ptr_left_30;
  int num_cdfs_29;
  int array_size_29;
  aom_cdf_prob *cdf_ptr_tr_29;
  aom_cdf_prob *cdf_ptr_left_29;
  int num_cdfs_28;
  int array_size_28;
  aom_cdf_prob *cdf_ptr_tr_28;
  aom_cdf_prob *cdf_ptr_left_28;
  int num_cdfs_27;
  int array_size_27;
  aom_cdf_prob *cdf_ptr_tr_27;
  aom_cdf_prob *cdf_ptr_left_27;
  int nsymbs;
  int j;
  int num_cdfs_26;
  int array_size_26;
  aom_cdf_prob *cdf_ptr_tr_26;
  aom_cdf_prob *cdf_ptr_left_26;
  int num_cdfs_25;
  int array_size_25;
  aom_cdf_prob *cdf_ptr_tr_25;
  aom_cdf_prob *cdf_ptr_left_25;
  int num_cdfs_24;
  int array_size_24;
  aom_cdf_prob *cdf_ptr_tr_24;
  aom_cdf_prob *cdf_ptr_left_24;
  int num_cdfs_23;
  int array_size_23;
  aom_cdf_prob *cdf_ptr_tr_23;
  aom_cdf_prob *cdf_ptr_left_23;
  int num_cdfs_22;
  int array_size_22;
  aom_cdf_prob *cdf_ptr_tr_22;
  aom_cdf_prob *cdf_ptr_left_22;
  int num_cdfs_21;
  int array_size_21;
  aom_cdf_prob *cdf_ptr_tr_21;
  aom_cdf_prob *cdf_ptr_left_21;
  int num_cdfs_20;
  int array_size_20;
  aom_cdf_prob *cdf_ptr_tr_20;
  aom_cdf_prob *cdf_ptr_left_20;
  int num_cdfs_19;
  int array_size_19;
  aom_cdf_prob *cdf_ptr_tr_19;
  aom_cdf_prob *cdf_ptr_left_19;
  int num_cdfs_18;
  int array_size_18;
  aom_cdf_prob *cdf_ptr_tr_18;
  aom_cdf_prob *cdf_ptr_left_18;
  int num_cdfs_17;
  int array_size_17;
  aom_cdf_prob *cdf_ptr_tr_17;
  aom_cdf_prob *cdf_ptr_left_17;
  int num_cdfs_16;
  int array_size_16;
  aom_cdf_prob *cdf_ptr_tr_16;
  aom_cdf_prob *cdf_ptr_left_16;
  int num_cdfs_15;
  int array_size_15;
  aom_cdf_prob *cdf_ptr_tr_15;
  aom_cdf_prob *cdf_ptr_left_15;
  int num_cdfs_14;
  int array_size_14;
  aom_cdf_prob *cdf_ptr_tr_14;
  aom_cdf_prob *cdf_ptr_left_14;
  int num_cdfs_13;
  int array_size_13;
  aom_cdf_prob *cdf_ptr_tr_13;
  aom_cdf_prob *cdf_ptr_left_13;
  int num_cdfs_12;
  int array_size_12;
  aom_cdf_prob *cdf_ptr_tr_12;
  aom_cdf_prob *cdf_ptr_left_12;
  int num_cdfs_11;
  int array_size_11;
  aom_cdf_prob *cdf_ptr_tr_11;
  aom_cdf_prob *cdf_ptr_left_11;
  int num_cdfs_10;
  int array_size_10;
  aom_cdf_prob *cdf_ptr_tr_10;
  aom_cdf_prob *cdf_ptr_left_10;
  int num_cdfs_9;
  int array_size_9;
  aom_cdf_prob *cdf_ptr_tr_9;
  aom_cdf_prob *cdf_ptr_left_9;
  int num_cdfs_8;
  int array_size_8;
  aom_cdf_prob *cdf_ptr_tr_8;
  aom_cdf_prob *cdf_ptr_left_8;
  int num_cdfs_7;
  int array_size_7;
  aom_cdf_prob *cdf_ptr_tr_7;
  aom_cdf_prob *cdf_ptr_left_7;
  int num_cdfs_6;
  int array_size_6;
  aom_cdf_prob *cdf_ptr_tr_6;
  aom_cdf_prob *cdf_ptr_left_6;
  int num_cdfs_5;
  int array_size_5;
  aom_cdf_prob *cdf_ptr_tr_5;
  aom_cdf_prob *cdf_ptr_left_5;
  int num_cdfs_4;
  int array_size_4;
  aom_cdf_prob *cdf_ptr_tr_4;
  aom_cdf_prob *cdf_ptr_left_4;
  int num_cdfs_3;
  int array_size_3;
  aom_cdf_prob *cdf_ptr_tr_3;
  aom_cdf_prob *cdf_ptr_left_3;
  int num_cdfs_2;
  int array_size_2;
  aom_cdf_prob *cdf_ptr_tr_2;
  aom_cdf_prob *cdf_ptr_left_2;
  int num_cdfs_1;
  int array_size_1;
  aom_cdf_prob *cdf_ptr_tr_1;
  aom_cdf_prob *cdf_ptr_left_1;
  int num_cdfs;
  int array_size;
  aom_cdf_prob *cdf_ptr_tr;
  aom_cdf_prob *cdf_ptr_left;
  int local_65c;
  int in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  nmv_context *in_stack_fffffffffffff9c8;
  nmv_context *in_stack_fffffffffffff9d0;
  int local_534;
  int local_2a4;
  
  avg_cdf_symbol(in_RDI,in_RSI,0x41,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0xc3,in_RSI + 0xc3,0x5a,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d1,in_RSI + 0x1d1,6,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1e3,in_RSI + 0x1e3,4,6,5,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1fb,in_RSI + 0x1fb,4,7,6,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x217,in_RSI + 0x217,4,8,7,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x237,in_RSI + 0x237,4,9,8,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x25b,in_RSI + 0x25b,4,10,9,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x283,in_RSI + 0x283,4,0xb,10,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x2af,in_RSI + 0x2af,4,0xc,0xb,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x2df,in_RSI + 0x2df,0x28,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x37f,in_RSI + 0x37f,0x1a4,5,4,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0xbb3,in_RSI + 0xbb3,0xd2,5,4,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0xfcd,in_RSI + 0xfcd,6,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0xfdf,in_RSI + 0xfdf,2,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0xfe5,in_RSI + 0xfe5,6,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0xff7,in_RSI + 0xff7,3,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1000,in_RSI + 0x1000,8,9,8,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1048,in_RSI + 0x1048,0x16,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x108a,in_RSI + 0x108a,0x16,0x11,0x10,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1200,in_RSI + 0x1200,4,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x120c,in_RSI + 0x120c,0x16,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x124e,in_RSI + 0x124e,4,5,4,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1262,in_RSI + 0x1262,0x16,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x12ba,in_RSI + 0x12ba,0x16,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x12fc,in_RSI + 0x12fc,7,8,7,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1334,in_RSI + 0x1334,7,8,7,in_EDX,in_ECX);
  for (local_2a4 = 0; local_2a4 < 7; local_2a4 = local_2a4 + 1) {
    avg_cdf_symbol(in_RDI + (long)local_2a4 * 0x2d + 0x136c,in_RSI + (long)local_2a4 * 0x2d + 0x136c
                   ,5,9,local_2a4 + 2,in_EDX,in_ECX);
    avg_cdf_symbol(in_RDI + (long)local_2a4 * 0x2d + 0x14a7,in_RSI + (long)local_2a4 * 0x2d + 0x14a7
                   ,5,9,local_2a4 + 2,in_EDX,in_ECX);
  }
  avg_cdf_symbol(in_RDI + 0x15e2,in_RSI + 0x15e2,0x15,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1621,in_RSI + 0x1621,2,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1627,in_RSI + 0x1627,5,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1636,in_RSI + 0x1636,0x12,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x166c,in_RSI + 0x166c,5,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x167b,in_RSI + 0x167b,9,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1696,in_RSI + 0x1696,9,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x16b1,in_RSI + 0x16b1,6,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x16c3,in_RSI + 0x16c3,0x15,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1702,in_RSI + 0x1702,6,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1714,in_RSI + 0x1714,6,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1726,in_RSI + 0x1726,3,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x172f,in_RSI + 0x172f,3,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1738,in_RSI + 0x1738,4,3,2,in_EDX,in_ECX);
  avg_nmv(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,
          in_stack_fffffffffffff9c0);
  avg_nmv(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,
          in_stack_fffffffffffff9c0);
  avg_cdf_symbol(in_RDI + 0x1862,in_RSI + 0x1862,1,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1865,in_RSI + 0x1865,3,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x186e,in_RSI + 0x186e,3,9,8,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1889,in_RSI + 0x1889,0x16,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x18cb,in_RSI + 0x18cb,1,6,5,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x18d1,in_RSI + 0x18d1,1,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x18d5,in_RSI + 0x18d5,1,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x18d8,in_RSI + 0x18d8,1,3,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x18db,in_RSI + 0x18db,4,0xe,0xd,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1913,in_RSI + 0x1913,0xd,0xf,0xd,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x19d6,in_RSI + 0x19d6,0xd,0xf,0xe,in_EDX,in_ECX);
  for (local_534 = 0; local_534 < 0x14; local_534 = local_534 + 1) {
    if (local_534 < 4) {
      avg_cdf_symbol(in_RDI + (long)local_534 * 0xb + 0x1a99,in_RSI + (long)local_534 * 0xb + 0x1a99
                     ,1,0xb,4,in_EDX,in_ECX);
    }
    else if (local_534 < 0x10) {
      avg_cdf_symbol(in_RDI + (long)local_534 * 0xb + 0x1a99,in_RSI + (long)local_534 * 0xb + 0x1a99
                     ,1,0xb,10,in_EDX,in_ECX);
    }
    else {
      avg_cdf_symbol(in_RDI + (long)local_534 * 0xb + 0x1a99,in_RSI + (long)local_534 * 0xb + 0x1a99
                     ,1,0xb,8,in_EDX,in_ECX);
    }
  }
  avg_cdf_symbol(in_RDI + 0x1b75,in_RSI + 0x1b75,0x10,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1bb5,in_RSI + 0x1bb5,0x19,0xe,0xd,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d13,in_RSI + 0x1d13,8,8,7,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d53,in_RSI + 0x1d53,3,4,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d5f,in_RSI + 0x1d5f,3,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d6b,in_RSI + 0x1d6b,3,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d77,in_RSI + 0x1d77,3,4,3,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d83,in_RSI + 0x1d83,1,5,4,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x1d9c,in_RSI + 0x1d9c,1,5,4,in_EDX,in_ECX);
  for (local_65c = 0; local_65c < 4; local_65c = local_65c + 1) {
    avg_cdf_symbol(in_RDI + (long)local_65c * 5 + 0x1d88,in_RSI + (long)local_65c * 5 + 0x1d88,1,5,4
                   ,in_EDX,in_ECX);
  }
  avg_cdf_symbol(in_RDI + 0x2115,in_RSI + 0x2115,0x34,0x11,7,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x2489,in_RSI + 0x2489,0x34,0x11,5,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x2841,in_RSI + 0x2841,4,0x11,0x10,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x2885,in_RSI + 0x2885,4,0x11,0xc,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x28c9,in_RSI + 0x28c9,4,0x11,2,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x290d,in_RSI + 0x290d,1,9,8,in_EDX,in_ECX);
  avg_cdf_symbol(in_RDI + 0x2916,in_RSI + 0x2916,6,0x11,0x10,in_EDX,in_ECX);
  return;
}

Assistant:

void av1_avg_cdf_symbols(FRAME_CONTEXT *ctx_left, FRAME_CONTEXT *ctx_tr,
                         int wt_left, int wt_tr) {
  AVERAGE_CDF(ctx_left->txb_skip_cdf, ctx_tr->txb_skip_cdf, 2);
  AVERAGE_CDF(ctx_left->eob_extra_cdf, ctx_tr->eob_extra_cdf, 2);
  AVERAGE_CDF(ctx_left->dc_sign_cdf, ctx_tr->dc_sign_cdf, 2);
  AVERAGE_CDF(ctx_left->eob_flag_cdf16, ctx_tr->eob_flag_cdf16, 5);
  AVERAGE_CDF(ctx_left->eob_flag_cdf32, ctx_tr->eob_flag_cdf32, 6);
  AVERAGE_CDF(ctx_left->eob_flag_cdf64, ctx_tr->eob_flag_cdf64, 7);
  AVERAGE_CDF(ctx_left->eob_flag_cdf128, ctx_tr->eob_flag_cdf128, 8);
  AVERAGE_CDF(ctx_left->eob_flag_cdf256, ctx_tr->eob_flag_cdf256, 9);
  AVERAGE_CDF(ctx_left->eob_flag_cdf512, ctx_tr->eob_flag_cdf512, 10);
  AVERAGE_CDF(ctx_left->eob_flag_cdf1024, ctx_tr->eob_flag_cdf1024, 11);
  AVERAGE_CDF(ctx_left->coeff_base_eob_cdf, ctx_tr->coeff_base_eob_cdf, 3);
  AVERAGE_CDF(ctx_left->coeff_base_cdf, ctx_tr->coeff_base_cdf, 4);
  AVERAGE_CDF(ctx_left->coeff_br_cdf, ctx_tr->coeff_br_cdf, BR_CDF_SIZE);
  AVERAGE_CDF(ctx_left->newmv_cdf, ctx_tr->newmv_cdf, 2);
  AVERAGE_CDF(ctx_left->zeromv_cdf, ctx_tr->zeromv_cdf, 2);
  AVERAGE_CDF(ctx_left->refmv_cdf, ctx_tr->refmv_cdf, 2);
  AVERAGE_CDF(ctx_left->drl_cdf, ctx_tr->drl_cdf, 2);
  AVERAGE_CDF(ctx_left->inter_compound_mode_cdf,
              ctx_tr->inter_compound_mode_cdf, INTER_COMPOUND_MODES);
  AVERAGE_CDF(ctx_left->compound_type_cdf, ctx_tr->compound_type_cdf,
              MASKED_COMPOUND_TYPES);
  AVERAGE_CDF(ctx_left->wedge_idx_cdf, ctx_tr->wedge_idx_cdf, 16);
  AVERAGE_CDF(ctx_left->interintra_cdf, ctx_tr->interintra_cdf, 2);
  AVERAGE_CDF(ctx_left->wedge_interintra_cdf, ctx_tr->wedge_interintra_cdf, 2);
  AVERAGE_CDF(ctx_left->interintra_mode_cdf, ctx_tr->interintra_mode_cdf,
              INTERINTRA_MODES);
  AVERAGE_CDF(ctx_left->motion_mode_cdf, ctx_tr->motion_mode_cdf, MOTION_MODES);
  AVERAGE_CDF(ctx_left->obmc_cdf, ctx_tr->obmc_cdf, 2);
  AVERAGE_CDF(ctx_left->palette_y_size_cdf, ctx_tr->palette_y_size_cdf,
              PALETTE_SIZES);
  AVERAGE_CDF(ctx_left->palette_uv_size_cdf, ctx_tr->palette_uv_size_cdf,
              PALETTE_SIZES);
  for (int j = 0; j < PALETTE_SIZES; j++) {
    int nsymbs = j + PALETTE_MIN_SIZE;
    AVG_CDF_STRIDE(ctx_left->palette_y_color_index_cdf[j],
                   ctx_tr->palette_y_color_index_cdf[j], nsymbs,
                   CDF_SIZE(PALETTE_COLORS));
    AVG_CDF_STRIDE(ctx_left->palette_uv_color_index_cdf[j],
                   ctx_tr->palette_uv_color_index_cdf[j], nsymbs,
                   CDF_SIZE(PALETTE_COLORS));
  }
  AVERAGE_CDF(ctx_left->palette_y_mode_cdf, ctx_tr->palette_y_mode_cdf, 2);
  AVERAGE_CDF(ctx_left->palette_uv_mode_cdf, ctx_tr->palette_uv_mode_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_inter_cdf, ctx_tr->comp_inter_cdf, 2);
  AVERAGE_CDF(ctx_left->single_ref_cdf, ctx_tr->single_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_ref_type_cdf, ctx_tr->comp_ref_type_cdf, 2);
  AVERAGE_CDF(ctx_left->uni_comp_ref_cdf, ctx_tr->uni_comp_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_ref_cdf, ctx_tr->comp_ref_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_bwdref_cdf, ctx_tr->comp_bwdref_cdf, 2);
  AVERAGE_CDF(ctx_left->txfm_partition_cdf, ctx_tr->txfm_partition_cdf, 2);
  AVERAGE_CDF(ctx_left->compound_index_cdf, ctx_tr->compound_index_cdf, 2);
  AVERAGE_CDF(ctx_left->comp_group_idx_cdf, ctx_tr->comp_group_idx_cdf, 2);
  AVERAGE_CDF(ctx_left->skip_mode_cdfs, ctx_tr->skip_mode_cdfs, 2);
  AVERAGE_CDF(ctx_left->skip_txfm_cdfs, ctx_tr->skip_txfm_cdfs, 2);
  AVERAGE_CDF(ctx_left->intra_inter_cdf, ctx_tr->intra_inter_cdf, 2);
  avg_nmv(&ctx_left->nmvc, &ctx_tr->nmvc, wt_left, wt_tr);
  avg_nmv(&ctx_left->ndvc, &ctx_tr->ndvc, wt_left, wt_tr);
  AVERAGE_CDF(ctx_left->intrabc_cdf, ctx_tr->intrabc_cdf, 2);
  AVERAGE_CDF(ctx_left->seg.pred_cdf, ctx_tr->seg.pred_cdf, 2);
  AVERAGE_CDF(ctx_left->seg.spatial_pred_seg_cdf,
              ctx_tr->seg.spatial_pred_seg_cdf, MAX_SEGMENTS);
  AVERAGE_CDF(ctx_left->filter_intra_cdfs, ctx_tr->filter_intra_cdfs, 2);
  AVERAGE_CDF(ctx_left->filter_intra_mode_cdf, ctx_tr->filter_intra_mode_cdf,
              FILTER_INTRA_MODES);
  AVERAGE_CDF(ctx_left->switchable_restore_cdf, ctx_tr->switchable_restore_cdf,
              RESTORE_SWITCHABLE_TYPES);
  AVERAGE_CDF(ctx_left->wiener_restore_cdf, ctx_tr->wiener_restore_cdf, 2);
  AVERAGE_CDF(ctx_left->sgrproj_restore_cdf, ctx_tr->sgrproj_restore_cdf, 2);
  AVERAGE_CDF(ctx_left->y_mode_cdf, ctx_tr->y_mode_cdf, INTRA_MODES);
  AVG_CDF_STRIDE(ctx_left->uv_mode_cdf[0], ctx_tr->uv_mode_cdf[0],
                 UV_INTRA_MODES - 1, CDF_SIZE(UV_INTRA_MODES));
  AVERAGE_CDF(ctx_left->uv_mode_cdf[1], ctx_tr->uv_mode_cdf[1], UV_INTRA_MODES);
  for (int i = 0; i < PARTITION_CONTEXTS; i++) {
    if (i < 4) {
      AVG_CDF_STRIDE(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 4,
                     CDF_SIZE(10));
    } else if (i < 16) {
      AVERAGE_CDF(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 10);
    } else {
      AVG_CDF_STRIDE(ctx_left->partition_cdf[i], ctx_tr->partition_cdf[i], 8,
                     CDF_SIZE(10));
    }
  }
  AVERAGE_CDF(ctx_left->switchable_interp_cdf, ctx_tr->switchable_interp_cdf,
              SWITCHABLE_FILTERS);
  AVERAGE_CDF(ctx_left->kf_y_cdf, ctx_tr->kf_y_cdf, INTRA_MODES);
  AVERAGE_CDF(ctx_left->angle_delta_cdf, ctx_tr->angle_delta_cdf,
              2 * MAX_ANGLE_DELTA + 1);
  AVG_CDF_STRIDE(ctx_left->tx_size_cdf[0], ctx_tr->tx_size_cdf[0], MAX_TX_DEPTH,
                 CDF_SIZE(MAX_TX_DEPTH + 1));
  AVERAGE_CDF(ctx_left->tx_size_cdf[1], ctx_tr->tx_size_cdf[1],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->tx_size_cdf[2], ctx_tr->tx_size_cdf[2],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->tx_size_cdf[3], ctx_tr->tx_size_cdf[3],
              MAX_TX_DEPTH + 1);
  AVERAGE_CDF(ctx_left->delta_q_cdf, ctx_tr->delta_q_cdf, DELTA_Q_PROBS + 1);
  AVERAGE_CDF(ctx_left->delta_lf_cdf, ctx_tr->delta_lf_cdf, DELTA_LF_PROBS + 1);
  for (int i = 0; i < FRAME_LF_COUNT; i++) {
    AVERAGE_CDF(ctx_left->delta_lf_multi_cdf[i], ctx_tr->delta_lf_multi_cdf[i],
                DELTA_LF_PROBS + 1);
  }
  AVG_CDF_STRIDE(ctx_left->intra_ext_tx_cdf[1], ctx_tr->intra_ext_tx_cdf[1], 7,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->intra_ext_tx_cdf[2], ctx_tr->intra_ext_tx_cdf[2], 5,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[1], ctx_tr->inter_ext_tx_cdf[1], 16,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[2], ctx_tr->inter_ext_tx_cdf[2], 12,
                 CDF_SIZE(TX_TYPES));
  AVG_CDF_STRIDE(ctx_left->inter_ext_tx_cdf[3], ctx_tr->inter_ext_tx_cdf[3], 2,
                 CDF_SIZE(TX_TYPES));
  AVERAGE_CDF(ctx_left->cfl_sign_cdf, ctx_tr->cfl_sign_cdf, CFL_JOINT_SIGNS);
  AVERAGE_CDF(ctx_left->cfl_alpha_cdf, ctx_tr->cfl_alpha_cdf,
              CFL_ALPHABET_SIZE);
}